

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.cc
# Opt level: O2

void __thiscall
S2ShapeIndexBufferedRegion::GetCellUnionBound
          (S2ShapeIndexBufferedRegion *this,vector<S2CellId,_std::allocator<S2CellId>_> *cellids)

{
  S1Angle value;
  int level;
  pointer pSVar1;
  int iVar2;
  int iVar3;
  pointer pSVar4;
  vector<S2CellId,_std::allocator<S2CellId>_> orig_cellids;
  S2CellId id;
  _Vector_base<S2CellId,_std::allocator<S2CellId>_> local_78;
  S2CellId local_58;
  S2Cap local_50;
  
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  S2ShapeIndexRegion<S2ShapeIndex>::S2ShapeIndexRegion
            ((S2ShapeIndexRegion<S2ShapeIndex> *)&local_50,(this->query_).base_.index_);
  S2ShapeIndexRegion<S2ShapeIndex>::GetCellUnionBound
            ((S2ShapeIndexRegion<S2ShapeIndex> *)&local_50,
             (vector<S2CellId,_std::allocator<S2CellId>_> *)&local_78);
  if ((long *)local_50.center_.c_[2] != (long *)0x0) {
    (**(code **)(*(long *)local_50.center_.c_[2] + 8))();
  }
  value = S1ChordAngle::ToAngle(&this->radius_);
  iVar2 = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,value.radians_);
  pSVar1 = local_78._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2 < 1) {
    S2Cap::Full();
    S2Cap::GetCellUnionBound(&local_50,cellids);
  }
  else {
    pSVar4 = (cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
        super__Vector_impl_data._M_finish != pSVar4) {
      (cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_finish = pSVar4;
    }
    for (pSVar4 = local_78._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1;
        pSVar4 = pSVar4 + 1) {
      local_58.id_ = pSVar4->id_;
      if ((local_58.id_ & 0xfffffffffffffff) == 0) {
        S2Cap::Full();
        S2Cap::GetCellUnionBound(&local_50,cellids);
        break;
      }
      iVar3 = S2CellId::level(&local_58);
      level = iVar3 + -1;
      if (iVar2 + -1 <= iVar3 + -1) {
        level = iVar2 + -1;
      }
      S2CellId::AppendVertexNeighbors(&local_58,level,cellids);
    }
  }
  std::_Vector_base<S2CellId,_std::allocator<S2CellId>_>::~_Vector_base(&local_78);
  return;
}

Assistant:

void S2ShapeIndexBufferedRegion::GetCellUnionBound(vector<S2CellId> *cellids)
    const {
  // We start with a covering of the original S2ShapeIndex, and then expand it
  // by replacing each cell with a block of 4 cells whose union contains the
  // original cell buffered by the given radius.
  //
  // This increases the number of cells in the covering by a factor of 4 and
  // increases the covered area by a factor of 16, so it is not a very good
  // covering, but it is much better than always returning the 6 face cells.
  vector<S2CellId> orig_cellids;
  MakeS2ShapeIndexRegion(&index()).GetCellUnionBound(&orig_cellids);

  double radians = radius_.ToAngle().radians();
  int max_level = S2::kMinWidth.GetLevelForMinValue(radians) - 1;
  if (max_level < 0) {
    return S2Cap::Full().GetCellUnionBound(cellids);
  }
  cellids->clear();
  for (S2CellId id : orig_cellids) {
    if (id.is_face()) {
      return S2Cap::Full().GetCellUnionBound(cellids);
    }
    id.AppendVertexNeighbors(min(max_level, id.level() - 1), cellids);
  }
}